

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::js::Generator::GenerateClassFields
          (Generator *this,GeneratorOptions *options,Printer *printer,Descriptor *desc)

{
  bool bVar1;
  int iVar2;
  FieldDescriptor *pFVar3;
  undefined4 local_2c;
  int i;
  Descriptor *desc_local;
  Printer *printer_local;
  GeneratorOptions *options_local;
  Generator *this_local;
  
  local_2c = 0;
  while( true ) {
    iVar2 = Descriptor::field_count(desc);
    if (iVar2 <= local_2c) break;
    pFVar3 = Descriptor::field(desc,local_2c);
    bVar1 = anon_unknown_0::IgnoreField(pFVar3);
    if (!bVar1) {
      pFVar3 = Descriptor::field(desc,local_2c);
      GenerateClassField(this,options,printer,pFVar3);
    }
    local_2c = local_2c + 1;
  }
  return;
}

Assistant:

void Generator::GenerateClassFields(const GeneratorOptions& options,
                                    io::Printer* printer,
                                    const Descriptor* desc) const {
  for (int i = 0; i < desc->field_count(); i++) {
    if (!IgnoreField(desc->field(i))) {
      GenerateClassField(options, printer, desc->field(i));
    }
  }
}